

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseVariantSet
          (AsciiParser *this,int64_t primIdx,int64_t parentPrimIdx,uint32_t depth,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
          *variantSetOut)

{
  uint8_t uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Specifier s;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *propNames;
  long lVar7;
  StreamReader *pSVar8;
  char *pcVar9;
  Specifier spec;
  string variantName;
  char mc;
  int64_t idx;
  PrimMetaMap metas;
  VariantContent variantContent;
  ostringstream ss_e;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
  variantContentMap;
  string local_388;
  string local_368;
  Identifier local_348;
  long local_328;
  _Any_data *local_320;
  int64_t local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
  local_308;
  long *local_2d8 [2];
  long local_2c8 [2];
  undefined1 local_2b8 [32];
  _Base_ptr local_298;
  size_t local_290;
  pointer plStack_288;
  iterator local_280;
  long *plStack_278;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  local_270;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> vStack_240;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>_>
  local_228;
  string local_1f8;
  int64_t local_1d8 [14];
  ios_base local_168 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
  local_60;
  
  if (variantSetOut ==
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
       *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"[ASCII]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"ParseVariantSet",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1d8,0x120d);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"[InternalError] variantSetOut arg is nullptr.",0x2d);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)local_2b8);
    if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
      operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
    ::std::ios_base::~ios_base(local_168);
  }
  else {
    bVar2 = Expect(this,'{');
    if (bVar2) {
      local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)primIdx;
      bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (!bVar2) {
        return false;
      }
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_320 = (_Any_data *)&this->_prim_idx_assign_fun;
      local_318 = parentPrimIdx;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        pSVar8 = this->_sr;
        uVar6 = pSVar8->idx_;
        if (((pSVar8->length_ <= uVar6) || (uVar1 = pSVar8->binary_[uVar6], uVar1 == '\0')) ||
           (pSVar8->idx_ = uVar6 + 1, uVar1 == '}')) {
          ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
          ::operator=(variantSetOut,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
                       *)&local_60);
          bVar2 = true;
          goto LAB_003e1e0b;
        }
        if (-1 < (long)uVar6) {
          pSVar8->idx_ = uVar6;
        }
        bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar2) goto LAB_003e1e08;
        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
        local_368._M_string_length = 0;
        local_368.field_2._M_local_buf[0] = '\0';
        bVar2 = ReadBasicType(this,&local_368);
        if (!bVar2) break;
        bVar2 = SkipWhitespace(this);
        if (!bVar2) goto LAB_003e1dec;
        local_308._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_308._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_308._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_308._M_impl.super__Rb_tree_header._M_header;
        local_308._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_308._M_impl.super__Rb_tree_header._M_header._M_right =
             local_308._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar2 = LookChar1(this,(char *)&local_348);
        if (!bVar2) {
LAB_003e1ddb:
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
          ::_M_erase(&local_308,
                     (_Link_type)local_308._M_impl.super__Rb_tree_header._M_header._M_parent);
          goto LAB_003e1dec;
        }
        if (((char)local_348.super_string._M_dataplus._M_p == '(') &&
           (bVar2 = ParsePrimMetas(this,(PrimMetaMap *)&local_308), !bVar2)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"[ASCII]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d8,"ParseVariantSet",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"():",3);
          poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1d8,0x124a);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d8,"Failed to parse PrimSpec metas in variant statement.",
                     0x34);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)local_2b8);
          if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
            operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
          ::std::ios_base::~ios_base(local_168);
          goto LAB_003e1ddb;
        }
        bVar2 = Expect(this,'{');
        if ((!bVar2) || (bVar2 = SkipCommentAndWhitespaceAndNewline(this,true), !bVar2))
        goto LAB_003e1ddb;
        local_2b8._8_4_ = _S_red;
        local_2b8._16_8_ = (_Link_type)0x0;
        local_2b8._24_8_ = local_2b8 + 8;
        local_270._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_270._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_280._M_current = (long *)0x0;
        plStack_278 = (long *)0x0;
        local_290 = 0;
        plStack_288 = (pointer)0x0;
        local_270._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_270._M_impl.super__Rb_tree_header._M_header;
        local_228._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        vStack_240.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_240.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_270._M_impl.super__Rb_tree_header._M_node_count = 0;
        vStack_240.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_228._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_228._M_impl.super__Rb_tree_header._M_header;
        local_228._M_impl.super__Rb_tree_header._M_node_count = 0;
        pSVar8 = this->_sr;
        uVar6 = pSVar8->length_;
        uVar4 = pSVar8->idx_;
        local_298 = (_Base_ptr)local_2b8._24_8_;
        local_270._M_impl.super__Rb_tree_header._M_header._M_right =
             local_270._M_impl.super__Rb_tree_header._M_header._M_left;
        local_228._M_impl.super__Rb_tree_header._M_header._M_right =
             local_228._M_impl.super__Rb_tree_header._M_header._M_left;
        if (uVar4 < uVar6) {
          while( true ) {
            uVar1 = pSVar8->binary_[uVar4];
            if ((uVar1 == '\0') || (pSVar8->idx_ = uVar4 + 1, uVar1 == '}')) break;
            bVar2 = false;
            if (((long)uVar4 < 0) || (uVar6 < uVar4)) goto LAB_003e171b;
            pSVar8->idx_ = uVar4;
            local_348.super_string._M_dataplus._M_p = (pointer)&local_348.super_string.field_2;
            local_348.super_string._M_string_length = 0;
            local_348.super_string.field_2._M_local_buf[0] = '\0';
            bVar2 = ReadBasicType(this,&local_348);
            if (!bVar2) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,"ParseVariantSet",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"():",3);
              poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1d8,0x126f);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
              lVar7 = 0x3c;
              pcVar9 = "Failed to parse an identifier in variantSet block statement.";
LAB_003e1689:
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,pcVar9,lVar7);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"\n",1);
LAB_003e16a2:
              ::std::__cxx11::stringbuf::str();
              PushError(this,(string *)&local_388);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388._M_dataplus._M_p != &local_388.field_2) {
                operator_delete(local_388._M_dataplus._M_p,
                                local_388.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
              ::std::ios_base::~ios_base(local_168);
LAB_003e16fc:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348.super_string._M_dataplus._M_p != &local_348.super_string.field_2) {
                operator_delete(local_348.super_string._M_dataplus._M_p,
                                CONCAT71(local_348.super_string.field_2._M_allocated_capacity._1_7_,
                                         local_348.super_string.field_2._M_local_buf[0]) + 1);
              }
              goto LAB_003e1718;
            }
            pSVar8 = this->_sr;
            uVar6 = pSVar8->idx_ - local_348.super_string._M_string_length;
            if (((long)uVar6 < 0) || (pSVar8->length_ < uVar6)) goto LAB_003e16fc;
            pSVar8->idx_ = uVar6;
            iVar3 = ::std::__cxx11::string::compare((char *)&local_348);
            if (iVar3 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,"ParseVariantSet",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"():",3);
              poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1d8,0x1277);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
              lVar7 = 0x29;
              pcVar9 = "Nested `variantSet` is not supported yet.";
              goto LAB_003e1689;
            }
            iVar3 = ::std::__cxx11::string::compare((char *)&local_348);
            if (iVar3 == 0) {
              spec = Def;
LAB_003e1417:
              local_1d8[0] = local_318;
              if ((this->_prim_idx_assign_fun).super__Function_base._M_manager == (_Manager_type)0x0
                 ) {
                ::std::__throw_bad_function_call();
              }
              local_328 = (*(this->_prim_idx_assign_fun)._M_invoker)(local_320,local_1d8);
              args = local_310;
              bVar2 = ParseBlock(this,spec,local_328,(int64_t)local_310,depth + 1,false);
              if (!bVar2) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,"ParseVariantSet",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"():",3);
                poVar5 = (ostream *)::std::ostream::operator<<(local_1d8,0x1290);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
                local_2d8[0] = local_2c8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2d8,"`{}` block parse failed.","");
                tinyusdz::to_string_abi_cxx11_(&local_1f8,(tinyusdz *)(ulong)spec,s);
                fmt::format<std::__cxx11::string>
                          (&local_388,(fmt *)local_2d8,(string *)&local_1f8,args);
                poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1d8,local_388._M_dataplus._M_p,
                                    local_388._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_388._M_dataplus._M_p != &local_388.field_2) {
                  operator_delete(local_388._M_dataplus._M_p,
                                  local_388.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                if (local_2d8[0] != local_2c8) {
                  operator_delete(local_2d8[0],local_2c8[0] + 1);
                }
                goto LAB_003e16a2;
              }
              if (local_280._M_current == plStack_278) {
                ::std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                          ((vector<long,std::allocator<long>> *)&plStack_288,local_280,&local_328);
              }
              else {
                *local_280._M_current = local_328;
                local_280._M_current = local_280._M_current + 1;
              }
            }
            else {
              iVar3 = ::std::__cxx11::string::compare((char *)&local_348);
              if (iVar3 == 0) {
                spec = Over;
                goto LAB_003e1417;
              }
              iVar3 = ::std::__cxx11::string::compare((char *)&local_348);
              if (iVar3 == 0) {
                spec = Class;
                goto LAB_003e1417;
              }
              bVar2 = ParsePrimProps(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                           *)&local_270,propNames);
              if (!bVar2) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,"ParseVariantSet",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"():",3);
                poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1d8,0x129b);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
                lVar7 = 0x1f;
                pcVar9 = "Failed to parse Prim attribute.";
                goto LAB_003e1689;
              }
            }
            bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348.super_string._M_dataplus._M_p != &local_348.super_string.field_2) {
              operator_delete(local_348.super_string._M_dataplus._M_p,
                              CONCAT71(local_348.super_string.field_2._M_allocated_capacity._1_7_,
                                       local_348.super_string.field_2._M_local_buf[0]) + 1);
            }
            if (!bVar2) goto LAB_003e1718;
            pSVar8 = this->_sr;
            uVar6 = pSVar8->length_;
            uVar4 = pSVar8->idx_;
            if (uVar6 <= uVar4) break;
          }
        }
        bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (bVar2) {
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
          ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                       *)local_2b8,&local_308);
          ::std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>
          ::_M_emplace_unique<std::__cxx11::string&,tinyusdz::ascii::AsciiParser::VariantContent&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>
                      *)&local_60,&local_368,(VariantContent *)local_2b8);
          bVar2 = true;
        }
        else {
LAB_003e1718:
          bVar2 = false;
        }
LAB_003e171b:
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>_>
        ::_M_erase(&local_228,
                   (_Link_type)local_228._M_impl.super__Rb_tree_header._M_header._M_parent);
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&vStack_240);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
        ::_M_erase(&local_270,
                   (_Link_type)local_270._M_impl.super__Rb_tree_header._M_header._M_parent);
        if (plStack_288 != (pointer)0x0) {
          operator_delete(plStack_288,(long)plStack_278 - (long)plStack_288);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                    *)local_2b8,(_Link_type)local_2b8._16_8_);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
        ::_M_erase(&local_308,
                   (_Link_type)local_308._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != &local_368.field_2) {
          operator_delete(local_368._M_dataplus._M_p,
                          CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                                   local_368.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar2) {
LAB_003e1e08:
          bVar2 = false;
LAB_003e1e0b:
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
          ::_M_erase(&local_60,
                     (_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
          return bVar2;
        }
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"[ASCII]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"ParseVariantSet",0xf);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1d8,0x1238);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"Failed to parse variant name for `variantSet` statement.",
                 0x38);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)local_2b8);
      if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
        operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      ::std::ios_base::~ios_base(local_168);
LAB_003e1dec:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,
                        CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                                 local_368.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_003e1e08;
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseVariantSet(
    const int64_t primIdx, const int64_t parentPrimIdx, const uint32_t depth,
    std::map<std::string, VariantContent> *variantSetOut) {
  if (!variantSetOut) {
    PUSH_ERROR_AND_RETURN_TAG(kAscii,
                              "[InternalError] variantSetOut arg is nullptr.");
  }

  // variantSet =
  // {
  //   "variantName0" ( metas ) { ... }
  //   "variantName1" ( metas ) { ... }
  //   ...
  // }
  if (!Expect('{')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  std::map<std::string, VariantContent> variantContentMap;

  // for each variantStatement
  while (!Eof()) {
    {
      char c;
      if (!Char1(&c)) {
        return false;
      }

      if (c == '}') {
        // end
        break;
      }

      Rewind(1);
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // string
    std::string variantName;
    if (!ReadBasicType(&variantName)) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Failed to parse variant name for `variantSet` statement.");
    }

    if (!SkipWhitespace()) {
      return false;
    }

    // Optional: PrimSpec meta
    PrimMetaMap metas;
    {
      char mc;
      if (!LookChar1(&mc)) {
        return false;
      }

      if (mc == '(') {
        if (!ParsePrimMetas(&metas)) {
          PUSH_ERROR_AND_RETURN_TAG(
              kAscii, "Failed to parse PrimSpec metas in variant statement.");
        }
      }
    }

    if (!Expect('{')) {
      return false;
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    VariantContent variantContent;

    while (!Eof()) {
      {
        char c;
        if (!Char1(&c)) {
          return false;
        }

        if (c == '}') {
          DCOUT("End block in variantSet stmt.");
          // end block
          break;
        }
      }

      if (!Rewind(1)) {
        return false;
      }

      DCOUT("Read first token in VariantSet stmt");
      Identifier tok;
      if (!ReadBasicType(&tok)) {
        PUSH_ERROR_AND_RETURN(
            "Failed to parse an identifier in variantSet block statement.");
      }

      if (!Rewind(tok.size())) {
        return false;
      }

      if (tok == "variantSet") {
        PUSH_ERROR_AND_RETURN("Nested `variantSet` is not supported yet.");
      }

      Specifier child_spec{Specifier::Invalid};
      if (tok == "def") {
        child_spec = Specifier::Def;
      } else if (tok == "over") {
        child_spec = Specifier::Over;
      } else if (tok == "class") {
        child_spec = Specifier::Class;
      }

      // No specifier => Assume properties only.
      // Has specifier => Prim
      if (child_spec != Specifier::Invalid) {
        // FIXME: Assign idx dedicated for variant.
        int64_t idx = _prim_idx_assign_fun(parentPrimIdx);
        DCOUT("enter parseBlock in variantSet. spec = "
              << to_string(child_spec) << ", idx = " << idx
              << ", rootIdx = " << primIdx);

        // recusive call
        if (!ParseBlock(child_spec, idx, primIdx, depth + 1,
                        /* in_variantStmt */ true)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("`{}` block parse failed.", to_string(child_spec)));
        }
        DCOUT(fmt::format("Done parse `{}` block.", to_string(child_spec)));

        DCOUT(fmt::format("Add primIdx {} to variant {}", idx, variantName));
        variantContent.primIndices.push_back(idx);

      } else {
        DCOUT("Enter ParsePrimProps.");
        if (!ParsePrimProps(&variantContent.props,
                            &variantContent.properties)) {
          PUSH_ERROR_AND_RETURN("Failed to parse Prim attribute.");
        }
        DCOUT(fmt::format("Done parse ParsePrimProps."));
      }

      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    DCOUT(fmt::format("variantSet item {} parsed.", variantName));

    variantContent.metas = metas;
    variantContentMap.emplace(variantName, variantContent);
  }

  (*variantSetOut) = std::move(variantContentMap);

  return true;
}